

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

void __thiscall
helics::MessageFederateManager::removeOrderedMessage(MessageFederateManager *this,uint index)

{
  long lVar1;
  long lVar2;
  pointer puVar3;
  handle handle;
  handle local_28;
  
  gmlc::libguarded::
  guarded_opt<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::mutex>::lock
            (&local_28,&this->messageOrder);
  puVar3 = ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3[-1] != index) {
    lVar1 = 0;
    do {
      lVar2 = lVar1;
      if ((pointer)((long)puVar3 + lVar2 + -4) ==
          ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
          .super__Vector_impl_data._M_start) goto LAB_001e9e3b;
      lVar1 = lVar2 + -4;
    } while (*(uint *)((long)puVar3 + lVar2 + -8) != index);
    if ((pointer)((long)puVar3 + lVar2) != puVar3) {
      memmove((void *)((long)puVar3 + lVar1),(pointer)((long)puVar3 + lVar2),-lVar1 - 4);
      puVar3 = ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  ((local_28.data)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + -1;
LAB_001e9e3b:
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return;
}

Assistant:

void MessageFederateManager::removeOrderedMessage(unsigned int index)
{
    auto handle = messageOrder.lock();
    if (index == handle->back()) {
        handle->pop_back();
    } else {
        auto term = handle->rend();
        for (auto ri = handle->rbegin() + 1; ri != term; ++ri) {
            if (*ri == index) {
                handle->erase(ri.base());
                break;
            }
        }
    }
}